

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O1

void __thiscall ipx::Maxvolume::Slice::Slice(Slice *this,Int m,Int n)

{
  ulong __n;
  ulong __n_00;
  double *pdVar1;
  size_t sVar2;
  size_type __n_01;
  allocator_type local_3e;
  bool local_3d;
  Int local_3c;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  sVar2 = (size_t)(n + m);
  (this->colscale)._M_size = sVar2;
  __n = sVar2 * 8;
  pdVar1 = (double *)operator_new(__n);
  (this->colscale)._M_data = pdVar1;
  memset(pdVar1,0,__n);
  __n_01 = (size_type)m;
  (this->invscale_basic)._M_size = __n_01;
  __n_00 = __n_01 * 8;
  local_3c = m;
  pdVar1 = (double *)operator_new(__n_00);
  (this->invscale_basic)._M_data = pdVar1;
  memset(pdVar1,0,__n_00);
  local_38 = &this->tblrow_used;
  local_3d = false;
  std::vector<bool,_std::allocator<bool>_>::vector(local_38,__n_01,&local_3d,&local_3e);
  (this->colweights)._M_size = sVar2;
  pdVar1 = (double *)operator_new(__n);
  (this->colweights)._M_data = pdVar1;
  memset(pdVar1,0,__n);
  IndexedVector::IndexedVector(&this->lhs,local_3c);
  IndexedVector::IndexedVector(&this->row,n + m);
  (this->work)._M_size = __n_01;
  pdVar1 = (double *)operator_new(__n_00);
  (this->work)._M_data = pdVar1;
  memset(pdVar1,0,__n_00);
  return;
}

Assistant:

Slice(Int m, Int n) :
        colscale(n+m), invscale_basic(m), tblrow_used(m), colweights(n+m),
        lhs(m), row(n+m), work(m) {}